

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
cfd::core::RandomNumberUtil::GetRandomIndexes
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          uint32_t length)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  int iVar3;
  ulong uVar4;
  size_t __i;
  _Base_ptr p_Var5;
  long lVar6;
  _Rb_tree_header *p_Var7;
  _Base_ptr p_Var8;
  uint uVar9;
  bool bVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  uniform_int_distribution<int> dist;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exist_value;
  _Rb_tree_color local_74;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  undefined4 local_68;
  uint32_t local_64;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  local_70 = __return_storage_ptr__;
  if ((GetRandomIndexes(unsigned_int)::rd == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetRandomIndexes(unsigned_int)::rd), iVar3 != 0)) {
    std::random_device::random_device(&GetRandomIndexes::rd);
    __cxa_atexit(std::random_device::~random_device,&GetRandomIndexes::rd,&__dso_handle);
    __cxa_guard_release(&GetRandomIndexes(unsigned_int)::rd);
  }
  if ((GetRandomIndexes(unsigned_int)::engine == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetRandomIndexes(unsigned_int)::engine), iVar3 != 0)) {
    uVar9 = ::std::random_device::_M_getval();
    uVar4 = (ulong)uVar9;
    lVar6 = 1;
    GetRandomIndexes::engine._M_x[0] = uVar4;
    do {
      uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar6);
      GetRandomIndexes::engine._M_x[lVar6] = uVar4;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x270);
    GetRandomIndexes::engine._M_p = 0x270;
    __cxa_guard_release(&GetRandomIndexes(unsigned_int)::engine);
  }
  local_68 = 0;
  local_64 = length;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (local_70,(ulong)length,(allocator_type *)&local_60);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (length != 0) {
    if (length == 1) {
      *(local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start = 0;
    }
    else {
      uVar9 = length - 1;
      if (uVar9 != 0) {
        uVar4 = 0;
        do {
          local_74 = ::std::uniform_int_distribution<int>::operator()
                               (&local_68,&GetRandomIndexes::engine,(param_type *)&local_68);
          if (length <= local_74) {
            local_74 = local_74 / length;
          }
          p_Var5 = &p_Var1->_M_header;
          p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00410575:
            (local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar4] = local_74;
            ::std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&local_60,&local_74);
            uVar4 = (ulong)((int)uVar4 + 1);
          }
          else {
            for (; (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
                p_Var8 = (&p_Var8->_M_left)[bVar10]) {
              bVar10 = (_Rb_tree_color)*(size_t *)(p_Var8 + 1) < local_74;
              if (!bVar10) {
                p_Var5 = p_Var8;
              }
            }
            p_Var7 = p_Var1;
            if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
               (p_Var7 = (_Rb_tree_header *)p_Var5,
               local_74 < (_Rb_tree_color)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
              p_Var7 = p_Var1;
            }
            if (p_Var7 == p_Var1) goto LAB_00410575;
          }
        } while ((uint)uVar4 < uVar9);
      }
      if (length == 0) {
        local_74 = _S_red;
      }
      else {
        p_Var5 = &p_Var1->_M_header;
        p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        _Var2 = _S_red;
        do {
          for (; local_74 = _Var2, p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[bVar10]) {
            bVar10 = p_Var8[1]._M_color < local_74;
            if (!bVar10) {
              p_Var5 = p_Var8;
            }
            _Var2 = local_74;
          }
          p_Var8 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
             (p_Var8 = p_Var5, local_74 < p_Var5[1]._M_color)) {
            p_Var8 = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)p_Var8 == p_Var1) {
            (local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar9] = local_74;
            break;
          }
          _Var2 = local_74 + _S_black;
          local_74 = length;
          p_Var5 = &p_Var1->_M_header;
          p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        } while (_Var2 != length);
      }
    }
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return local_70;
}

Assistant:

std::vector<uint32_t> RandomNumberUtil::GetRandomIndexes(uint32_t length) {
#if defined(_WIN32) && defined(__GNUC__) && (__GNUC__ < 9)
  // for mingw gcc lower 9
  static std::mt19937 engine(static_cast<unsigned int>(time(nullptr)));
#else
  static std::random_device rd;
  static std::mt19937 engine(rd());
#endif
  std::uniform_int_distribution<> dist(0, length);
  std::vector<uint32_t> result(length);
  std::set<uint32_t> exist_value;
  uint32_t value;

  if (length == 1) {
    result[0] = 0;
  } else if (length > 1) {
    uint32_t index = 0;
    while (index < (length - 1)) {
      value = dist(engine);
      if (value >= length) {
        value /= length;
      }
      if ((exist_value.empty()) || (exist_value.count(value) == 0)) {  // MSVC
        result[index] = value;
        exist_value.insert(value);
        ++index;
      }
    }

    for (value = 0; value < length; ++value) {
      if (exist_value.count(value) == 0) {
        result[length - 1] = value;
        break;
      }
    }
  }

  return result;
}